

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  LodePNGColorType colortype;
  uint uVar5;
  uchar a_00;
  LodePNGColorStats *pLVar6;
  LodePNGColorMode *mode;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  undefined8 in_R10;
  undefined7 uVar13;
  size_t i;
  byte bVar14;
  size_t sVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_11a;
  unsigned_short local_118;
  unsigned_short local_116;
  unsigned_short local_114;
  byte local_111;
  uint local_110;
  uint local_10c;
  uchar local_107;
  byte local_106;
  byte local_105;
  uint local_104;
  LodePNGColorStats *local_100;
  size_t local_f8;
  LodePNGColorMode *local_f0;
  uchar *local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  size_t local_d0;
  uint local_c8;
  uint local_c4;
  size_t local_c0;
  ColorTree local_b8;
  
  local_f8 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_e8 = in;
  uVar8 = lodepng_can_have_alpha(mode_in);
  uVar10 = mode_in->bitdepth;
  local_f0 = mode_in;
  local_d4 = getNumColorChannels(colortype);
  local_d4 = local_d4 * uVar10;
  uVar10 = stats->bits;
  local_d0 = CONCAT71(local_d0._1_7_,local_d4 == 1 && uVar10 == 1);
  local_c8 = 0x101;
  if ((local_d4 < 9) &&
     (local_c8 = (1 << ((byte)local_d4 & 0x1f)) + stats->numcolors, 0x100 < local_c8)) {
    local_c8 = 0x101;
  }
  local_10c = CONCAT31(local_10c._1_3_,(colortype & ~LCT_GREY_ALPHA) == LCT_GREY);
  stats->numpixels = stats->numpixels + local_f8;
  bVar20 = stats->allow_palette == 0;
  local_b8.children[0xc] = (ColorTree *)0x0;
  local_b8.children[0xd] = (ColorTree *)0x0;
  local_b8.children[0xe] = (ColorTree *)0x0;
  local_b8.children[0xf] = (ColorTree *)0x0;
  local_b8.children[8] = (ColorTree *)0x0;
  local_b8.children[9] = (ColorTree *)0x0;
  local_b8.children[10] = (ColorTree *)0x0;
  local_b8.children[0xb] = (ColorTree *)0x0;
  local_b8.children[4] = (ColorTree *)0x0;
  local_b8.children[5] = (ColorTree *)0x0;
  local_b8.children[6] = (ColorTree *)0x0;
  local_b8.children[7] = (ColorTree *)0x0;
  local_b8.children[0] = (ColorTree *)0x0;
  local_b8.children[1] = (ColorTree *)0x0;
  local_b8.children[2] = (ColorTree *)0x0;
  local_b8.children[3] = (ColorTree *)0x0;
  local_b8.index = -1;
  local_110 = 1;
  if (stats->alpha == 0) {
    local_110 = uVar8 ^ 1;
  }
  uVar8 = stats->colored;
  bVar17 = local_d4 <= uVar10;
  bVar18 = local_c8 <= stats->numcolors;
  local_104 = 0;
  bVar19 = (uVar10 == 0x10 || bVar20) || bVar18;
  if (((uVar10 != 0x10 && !bVar20) && !bVar18) && (stats->numcolors != 0)) {
    uVar16 = 0;
    do {
      local_104 = color_tree_add(&local_b8,stats->palette[uVar16 * 4],stats->palette[uVar16 * 4 + 1]
                                 ,stats->palette[uVar16 * 4 + 2],stats->palette[uVar16 * 4 + 3],
                                 (uint)uVar16);
      uVar10 = local_104;
      if (local_104 != 0) goto LAB_0012c10e;
      uVar16 = uVar16 + 1;
    } while (uVar16 < stats->numcolors);
  }
  bVar11 = (byte)local_10c | uVar8 != 0;
  bVar12 = bVar17 | (byte)local_d0;
  bVar20 = true;
  local_100 = stats;
  if (local_f0->bitdepth == 0x10) {
    local_116 = 0;
    local_118 = 0;
    local_11a = 0;
    local_114 = 0;
    bVar20 = local_f8 == 0;
    if (!bVar20) {
      local_10c = CONCAT31(local_10c._1_3_,bVar11);
      getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,0,local_f0);
      stats = local_100;
      if ((local_116 & 0xff) == local_116 >> 8) {
        sVar15 = 1;
        do {
          if ((((local_118 & 0xff) != local_118 >> 8) || ((local_11a & 0xff) != local_11a >> 8)) ||
             ((local_114 & 0xff) != local_114 >> 8)) break;
          bVar20 = local_f8 == sVar15;
          if (bVar20) goto LAB_0012ba18;
          getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,sVar15,local_f0);
          sVar15 = sVar15 + 1;
        } while ((local_116 & 0xff) == local_116 >> 8);
      }
      stats->bits = 0x10;
      bVar12 = 1;
      bVar19 = true;
LAB_0012ba18:
      bVar11 = (byte)local_10c;
    }
  }
  if (bVar20) {
    local_116 = local_116 & 0xff00;
    local_118 = local_118 & 0xff00;
    local_11a = local_11a & 0xff00;
    local_114 = local_114 & 0xff00;
    if (local_f8 != 0) {
      local_10c = (uint)bVar11;
      local_c0 = local_f8 - 1;
      sVar15 = 0;
      do {
        uVar10 = local_d4;
        getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_118,(uchar *)&local_11a,
                           (uchar *)&local_114,local_e8,sVar15,local_f0);
        if ((bVar12 == 0) && (stats->bits < 8)) {
          uVar8 = 1;
          if (1 < (byte)((byte)local_116 + 1)) {
            uVar8 = 8;
            if ((uint)(byte)local_116 * -0xf0f0f0f < 0xf0f0f10) {
              uVar8 = (uint)(0x3030303 < (uint)(byte)local_116 * -0x3030303) * 2 + 2;
            }
          }
          if (stats->bits < uVar8) {
            stats->bits = uVar8;
          }
        }
        uVar8 = stats->bits;
        uVar16 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
        bVar20 = local_10c == 0;
        local_10c = 1;
        bVar7 = (byte)local_118;
        bVar11 = (byte)local_11a;
        if (bVar20) {
          if ((byte)local_116 == (byte)local_118) {
            uVar16 = 0;
            local_10c = 0;
            if ((byte)local_116 == (byte)local_11a) goto LAB_0012bb49;
          }
          stats->colored = 1;
          uVar13 = (undefined7)(uVar16 >> 8);
          uVar16 = CONCAT71(uVar13,1);
          local_10c = 1;
          if (uVar8 < 8) {
            stats->bits = 8;
            uVar16 = CONCAT71(uVar13,1);
          }
        }
LAB_0012bb49:
        a_00 = (uchar)local_114;
        if (local_110 == 0) {
          if ((stats->key_r == (local_116 & 0xff)) && (stats->key_g == (local_118 & 0xff))) {
            bVar20 = stats->key_b == (local_11a & 0xff);
          }
          else {
            bVar20 = false;
          }
          if ((uchar)local_114 == 0xff) {
            bVar14 = 0;
            local_110 = 0;
            if ((bool)(stats->key != 0 & bVar20)) {
              stats->alpha = 1;
              stats->key = 0;
              uVar5 = stats->bits;
              goto joined_r0x0012bd5c;
            }
          }
          else {
            if (((uchar)local_114 != '\0') || (!(bool)(stats->key == 0 | bVar20))) {
              stats->alpha = 1;
              stats->key = 0;
              uVar5 = stats->bits;
joined_r0x0012bd5c:
              if (uVar5 < 8) {
                stats->bits = 8;
              }
              goto LAB_0012bb54;
            }
            local_110 = 0;
            if ((stats->alpha == 0) && (stats->key == 0)) {
              stats->key = 1;
              stats->key_r = local_116 & 0xff;
              stats->key_g = local_118 & 0xff;
              stats->key_b = local_11a & 0xff;
              bVar14 = 0;
              local_110 = 0;
            }
            else {
              bVar14 = 0;
            }
          }
        }
        else {
LAB_0012bb54:
          bVar14 = 1;
          local_110 = 1;
        }
        local_d0 = sVar15;
        if (bVar19) {
          bVar19 = true;
          bVar12 = uVar10 <= uVar8;
        }
        else {
          local_106 = (byte)local_116;
          local_105 = (byte)local_118;
          local_c4 = (uint)(byte)local_116;
          local_dc = (uint)uVar16;
          local_111 = uVar10 <= uVar8;
          local_d8 = uVar8;
          iVar9 = color_tree_get(&local_b8,(byte)local_116,(byte)local_118,(byte)local_11a,
                                 (uchar)local_114);
          pLVar6 = local_100;
          uVar16 = (ulong)local_dc;
          bVar19 = false;
          uVar8 = local_d8;
          bVar12 = local_111;
          if (iVar9 < 0) {
            local_107 = a_00;
            local_104 = CONCAT31(local_104._1_3_,bVar11);
            uVar10 = color_tree_add(&local_b8,(uchar)local_c4,bVar7,bVar11,a_00,local_100->numcolors
                                   );
            if (uVar10 != 0) goto LAB_0012c10e;
            uVar10 = pLVar6->numcolors;
            if ((ulong)uVar10 < 0x100) {
              uVar16 = (ulong)(uVar10 * 4);
              pLVar6->palette[(ulong)uVar10 * 4] = local_106;
              pLVar6->palette[uVar16 + 1] = local_105;
              pLVar6->palette[uVar16 + 2] = (uchar)local_104;
              pLVar6->palette[uVar16 + 3] = local_107;
            }
            pLVar6->numcolors = uVar10 + 1;
            bVar19 = local_c8 <= uVar10 + 1;
            local_104 = 0;
            uVar16 = (ulong)local_dc;
            uVar8 = local_d8;
            bVar12 = local_111;
          }
        }
        bVar11 = (byte)uVar16 & bVar14 & bVar19;
        in_R10 = CONCAT71((int7)(uVar16 >> 8),bVar11);
        stats = local_100;
      } while (((bVar11 & local_d4 <= uVar8) == 0) && (sVar15 = local_d0 + 1, local_c0 != local_d0))
      ;
    }
    if ((stats->key != 0) && (local_f8 != 0 && stats->alpha == 0)) {
      sVar15 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_118,(uchar *)&local_11a,
                           (uchar *)&local_114,local_e8,sVar15,local_f0);
        if (((((uchar)local_114 != '\0') && (stats->key_r == (local_116 & 0xff))) &&
            (stats->key_g == (local_118 & 0xff))) && (stats->key_b == (local_11a & 0xff))) {
          stats->alpha = 1;
          stats->key = 0;
          if (stats->bits < 8) {
            stats->bits = 8;
          }
        }
        sVar15 = sVar15 + 1;
      } while (local_f8 != sVar15);
    }
    uVar1 = stats->key_r;
    uVar2 = stats->key_g;
    uVar3 = stats->key_b;
    uVar4 = *(undefined2 *)&stats->field_0xe;
    auVar21._6_2_ = uVar4;
    auVar21._4_2_ = uVar3;
    auVar21._2_2_ = uVar2;
    auVar21._0_2_ = uVar1;
    auVar21._8_8_ = 0;
    auVar22 = vpsllw_avx(auVar21,8);
    auVar21 = vpaddw_avx(auVar21,auVar22);
    stats->key_r = (short)auVar21._0_4_;
    stats->key_g = (short)((uint)auVar21._0_4_ >> 0x10);
    stats->key_b = (short)(*(int *)&stats->key_b << 8) + (short)*(int *)&stats->key_b;
    uVar10 = local_104;
  }
  else {
    local_116 = 0;
    local_118 = 0;
    local_11a = 0;
    local_114 = 0;
    if (local_f8 != 0) {
      sVar15 = local_f8 - 1;
      i = 0;
      do {
        getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,i,local_f0);
        bVar7 = 1;
        bVar20 = bVar11 == 0;
        bVar11 = 1;
        if (bVar20) {
          if (local_116 == local_118) {
            bVar7 = 0;
            bVar11 = 0;
            if (local_116 == local_11a) goto LAB_0012be4f;
          }
          stats->colored = 1;
          bVar7 = 1;
          bVar11 = 1;
        }
LAB_0012be4f:
        if (local_110 == 0) {
          if ((local_116 == stats->key_r) && (local_118 == stats->key_g)) {
            bVar20 = local_11a == stats->key_b;
          }
          else {
            bVar20 = false;
          }
          if (local_114 == 0xffff) {
            bVar14 = 0;
            local_110 = 0;
            if ((bool)(stats->key != 0 & bVar20)) goto LAB_0012bef5;
          }
          else {
            if ((local_114 != 0) || (stats->key != 0 && !bVar20)) {
LAB_0012bef5:
              stats->alpha = 1;
              stats->key = 0;
              goto LAB_0012bf07;
            }
            if ((stats->alpha == 0) && (stats->key == 0)) {
              stats->key = 1;
              stats->key_r = local_116;
              stats->key_g = local_118;
              stats->key_b = local_11a;
              bVar14 = 0;
              local_110 = 0;
            }
            else {
              bVar14 = 0;
              local_110 = 0;
            }
          }
        }
        else {
LAB_0012bf07:
          bVar14 = 1;
          local_110 = 1;
        }
      } while (((bVar7 & bVar14 & bVar19 & bVar12 != 0) == 0) &&
              (bVar20 = sVar15 != i, i = i + 1, bVar20));
    }
    mode = local_f0;
    uVar10 = local_104;
    if ((stats->key != 0) && (local_f8 != 0 && local_100->alpha == 0)) {
      sVar15 = 0;
      do {
        getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,sVar15,mode);
        if ((((local_114 != 0) && (local_116 == local_100->key_r)) &&
            (local_118 == local_100->key_g)) && (local_11a == local_100->key_b)) {
          local_100->alpha = 1;
          local_100->key = 0;
        }
        sVar15 = sVar15 + 1;
        uVar10 = local_104;
      } while (local_f8 != sVar15);
    }
  }
LAB_0012c10e:
  local_104 = uVar10;
  color_tree_cleanup(&local_b8);
  return local_104;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
  const unsigned char* in, unsigned w, unsigned h,
  const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if (bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if (!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if (stats->alpha) alpha_done = 1;
  if (stats->colored) colored_done = 1;
  if (stats->bits == 16) numcolors_done = 1;
  if (stats->bits >= bpp) bits_done = 1;
  if (stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if (!numcolors_done) {
    for (i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if (error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if (mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if ((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
        (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if (sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if (!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if (bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if (stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if (!numcolors_done) {
        if (!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if (error) goto cleanup;
          if (stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}